

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O1

PosFilter *
indirect_filter(PosFilter *__return_storage_ptr__,Ray *r,Random *rng,int depth,int maxdepth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  pointer pSVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double pdf;
  Vector v;
  PosFilter res;
  Vector v_1;
  Vector wi;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  undefined8 local_158;
  double local_120;
  undefined1 local_118 [16];
  double local_108;
  undefined1 local_f8 [16];
  PosFilter local_e8;
  Vector local_b8;
  undefined1 local_98 [16];
  double local_88;
  Vector local_80;
  Ray local_68;
  
  uVar6 = (int)((long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x49249249;
  uVar7 = 0;
  if (uVar6 == 0) {
    local_158 = 1e+20;
  }
  else {
    lVar8 = (long)(int)uVar6;
    uVar10 = 0x78b58c40;
    uVar11 = 0x4415af1d;
    lVar9 = lVar8 * 0x70;
    do {
      uVar6 = uVar6 - 1;
      local_158 = (double)CONCAT44(uVar11,uVar10);
      dVar16 = Sphere::Intersect((Sphere *)
                                 ((long)&spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].c.x + lVar9),
                                 r);
      if (dVar16 != 0.0 && dVar16 < local_158) {
        uVar7 = (ulong)uVar6;
        local_158 = dVar16;
      }
      uVar10 = SUB84(local_158,0);
      uVar11 = (undefined4)((ulong)local_158 >> 0x20);
      lVar8 = lVar8 + -1;
      lVar9 = lVar9 + -0x70;
    } while (lVar8 != 0);
    uVar7 = (ulong)(int)uVar7;
  }
  pSVar5 = spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1e+20 <= local_158) {
    (__return_storage_ptr__->second).y = 0.0;
    (__return_storage_ptr__->second).z = 0.0;
    (__return_storage_ptr__->first).z = 0.0;
    (__return_storage_ptr__->second).x = 0.0;
    (__return_storage_ptr__->first).x = 0.0;
    (__return_storage_ptr__->first).y = 0.0;
  }
  else {
    dVar14 = (r->d).z * local_158 + (r->o).z;
    dVar15 = dVar14 - spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7].c.z;
    dVar12 = local_158 * (r->d).x + (r->o).x;
    dVar13 = local_158 * (r->d).y + (r->o).y;
    auVar17._0_8_ =
         dVar12 - spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7].c.x;
    auVar17._8_8_ =
         dVar13 - spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7].c.y;
    dVar16 = dVar15 * dVar15 + auVar17._0_8_ * auVar17._0_8_ + auVar17._8_8_ * auVar17._8_8_;
    if (dVar16 < 0.0) {
      dVar16 = sqrt(dVar16);
    }
    else {
      dVar16 = SQRT(dVar16);
    }
    local_108 = dVar15 / dVar16;
    auVar1._8_4_ = SUB84(dVar16,0);
    auVar1._0_8_ = dVar16;
    auVar1._12_4_ = (int)((ulong)dVar16 >> 0x20);
    local_118 = divpd(auVar17,auVar1);
    dVar16 = local_118._0_8_;
    if (0.0 <= (r->d).z * local_108 + (r->d).x * dVar16 + local_118._8_8_ * (r->d).y) {
      local_118._8_8_ = -local_118._8_8_;
      local_118._0_8_ = -dVar16;
      local_108 = -local_108;
    }
    if (depth < maxdepth) {
      dVar15 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&rng->_gen);
      local_198 = (rng->_dist)._M_param._M_a;
      local_188 = (rng->_dist)._M_param._M_b;
      dVar16 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&rng->_gen);
      local_f8._8_4_ = extraout_XMM0_Dc;
      local_f8._0_8_ = dVar16;
      local_f8._12_4_ = extraout_XMM0_Dd;
      dVar16 = (rng->_dist)._M_param._M_b;
      uStack_180._0_4_ = SUB84(dVar16,0);
      uStack_180._4_4_ = (int)((ulong)dVar16 >> 0x20);
      dVar16 = (rng->_dist)._M_param._M_a;
      uStack_190._0_4_ = SUB84(dVar16,0);
      uStack_190._4_4_ = (int)((ulong)dVar16 >> 0x20);
      dVar16 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&rng->_gen);
      local_88 = (rng->_dist)._M_param._M_a;
      local_88 = ((rng->_dist)._M_param._M_b - local_88) * dVar16 + local_88;
      uStack_190 = (double)local_f8._0_8_ * (uStack_180 - uStack_190) + uStack_190;
      local_98._8_4_ = SUB84(uStack_190,0);
      local_98._0_8_ = dVar15 * (local_188 - local_198) + local_198;
      local_98._12_4_ = (int)((ulong)uStack_190 >> 0x20);
      local_b8.x = -(r->d).x;
      local_b8.y = -(r->d).y;
      local_b8.z = -(r->d).z;
      Material::Sample(&local_80,&pSVar5[uVar7].mat,&local_b8,(Vector *)local_118,(Vector *)local_98
                       ,&local_120);
      dVar16 = local_80.z * local_108 +
               local_80.x * (double)local_118._0_8_ + local_80.y * (double)local_118._8_8_;
      Material::Reflectance
                (&local_e8.first,&pSVar5[uVar7].mat,&local_80,&local_b8,(Vector *)local_118);
      dVar4 = local_e8.first.z * dVar16;
      dVar15 = dVar16 * local_e8.first.x;
      auVar2._8_4_ = SUB84(dVar16 * local_e8.first.y,0);
      auVar2._0_8_ = dVar15;
      auVar2._12_4_ = (int)((ulong)(dVar16 * local_e8.first.y) >> 0x20);
      local_68.d.x = local_80.x;
      local_68.d.y = local_80.y;
      local_68.d.z = local_80.z;
      local_68.o.x = dVar12;
      local_68.o.y = dVar13;
      local_68.o.z = dVar14;
      indirect_filter(&local_e8,&local_68,rng,depth + 1,maxdepth);
      local_120 = 1.0 / local_120;
      uStack_180 = auVar2._8_8_;
      dVar16 = local_120 * local_e8.second.x * dVar15;
      dVar12 = local_120 * local_e8.second.y * uStack_180;
      (__return_storage_ptr__->first).x = local_e8.first.x;
      (__return_storage_ptr__->first).y = local_e8.first.y;
      (__return_storage_ptr__->first).z = local_e8.first.z;
      auVar3._8_4_ = SUB84(dVar12,0);
      auVar3._0_8_ = dVar16;
      auVar3._12_4_ = (int)((ulong)dVar12 >> 0x20);
      (__return_storage_ptr__->second).x = dVar16;
      (__return_storage_ptr__->second).y = (double)auVar3._8_8_;
      (__return_storage_ptr__->second).z = dVar4 * local_e8.second.z * local_120;
    }
    else {
      (__return_storage_ptr__->first).x = dVar12;
      (__return_storage_ptr__->first).y = dVar13;
      (__return_storage_ptr__->first).z = dVar14;
      (__return_storage_ptr__->second).x = 1.0;
      (__return_storage_ptr__->second).y = 1.0;
      (__return_storage_ptr__->second).z = 1.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PosFilter indirect_filter(const Ray &r, Random& rng, int depth, int maxdepth=2){
   double t;                               // distance to Intersection
   int id=0;                               // id of Intersected object
   if (!Intersect(spheres, r, t, id)) return PosFilter(Vector(), Vector()); // if miss, return black
   const Sphere&   obj = spheres[id];      // the hit object
   const Material& mat = obj.mat;          // Its material
   Vector x  = r.o+r.d*t,
          n  = (x-obj.c).Normalize(),
          nl = Vector::Dot(n,r.d) < 0 ? n:n*-1;

   // Once you reach the max depth, return the hit position and the filter's
   // value using the recursive form.
   if(depth >= maxdepth) {
      return PosFilter(x, Vector(1.0f, 1.0f, 1.0f));

   // Main covariance computation. First this code generate a new direction
   // and query the covariance+radiance in that direction. Then, it computes
   // the covariance after the reflection/refraction.
   } else {
      /* Sampling a new direction + recursive call */
      double pdf;
      const auto e   = Vector(rng(), rng(), rng());
      const auto wo  = -r.d;
      const auto wi  = mat.Sample(wo, nl, e, pdf);
            auto f   = Vector::Dot(wi, nl)*mat.Reflectance(wi, wo, nl);
      const auto res = indirect_filter(Ray(x, wi), rng, depth+1, maxdepth);
      return PosFilter(res.first, (1.f/pdf) * f.Multiply(res.second));
   }
}